

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O2

void anon_unknown.dwarf_856b6::AssertInt16Equals
               (uint16_t expected,char *s,ParseIntTypeCombo parse_type)

{
  int iVar1;
  size_t sVar2;
  Message *message;
  char *pcVar3;
  unsigned_short actual;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  uint16_t local_42;
  AssertHelper local_40;
  AssertionResult gtest_ar;
  char *local_28;
  
  local_42 = expected;
  local_28 = s;
  sVar2 = strlen(s);
  pcVar3 = s + sVar2;
  if (parse_type == Both) {
    local_50.ptr_._0_4_ = 0;
    local_40.data_._0_4_ = wabt::ParseInt16(s,pcVar3,&actual,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              ((internal *)&gtest_ar,"Result::Ok",
               "parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",(Enum *)&local_50,
               (Result *)&local_40);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      message = testing::Message::operator<<((Message *)&local_50,&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar1 = 0x2d;
      goto LAB_00200536;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
              ((internal *)&gtest_ar,"expected","actual",&local_42,&actual);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar1 = 0x2f;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
LAB_00200280:
      local_50.ptr_._0_4_ = 0;
      local_40.data_._0_4_ = wabt::ParseInt16(local_28,pcVar3,&actual,SignedAndUnsigned);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                ((internal *)&gtest_ar,"Result::Ok",
                 "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                 (Result *)&local_40);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_50);
        message = testing::Message::operator<<((Message *)&local_50,&local_28);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar1 = 0x38;
        goto LAB_00200536;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                ((internal *)&gtest_ar,"expected","actual",&local_42,&actual);
      if (gtest_ar.success_ != false) goto LAB_0020055f;
      testing::Message::Message((Message *)&local_50);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar1 = 0x3a;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
               ,iVar1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
  }
  else {
    local_50.ptr_._0_4_ = 1;
    local_40.data_._0_4_ = wabt::ParseInt16(s,pcVar3,&actual,UnsignedOnly);
    testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
              ((internal *)&gtest_ar,"Result::Error",
               "parse_int(s, end, &actual, ParseIntType::UnsignedOnly)",(Enum *)&local_50,
               (Result *)&local_40);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_50);
      message = testing::Message::operator<<((Message *)&local_50,&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar1 = 0x32;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      if (parse_type - SignedAndUnsigned < 2) goto LAB_00200280;
      local_50.ptr_._0_4_ = 1;
      local_40.data_._0_4_ = wabt::ParseInt16(local_28,pcVar3,&actual,SignedAndUnsigned);
      testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
                ((internal *)&gtest_ar,"Result::Error",
                 "parse_int(s, end, &actual, ParseIntType::SignedAndUnsigned)",(Enum *)&local_50,
                 (Result *)&local_40);
      if (gtest_ar.success_ != false) goto LAB_0020055f;
      testing::Message::Message((Message *)&local_50);
      message = testing::Message::operator<<((Message *)&local_50,&local_28);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar1 = 0x3d;
    }
LAB_00200536:
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
               ,iVar1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_40,message);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_50);
LAB_0020055f:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void AssertInt16Equals(uint16_t expected,
                       const char* s,
                       ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt16, parse_type);
}